

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

int luv_os_get_passwd(lua_State *L)

{
  int status;
  undefined1 auStack_40 [4];
  int ret;
  uv_passwd_t pwd;
  lua_State *L_local;
  
  pwd.homedir = (char *)L;
  status = uv_os_get_passwd((uv_passwd_t *)auStack_40);
  if (status < 0) {
    L_local._4_4_ = luv_error((lua_State *)pwd.homedir,status);
  }
  else {
    lua_createtable((lua_State *)pwd.homedir,0,0);
    if (_auStack_40 != (char *)0x0) {
      lua_pushstring((lua_State *)pwd.homedir,_auStack_40);
      lua_setfield((lua_State *)pwd.homedir,-2,"username");
    }
    if (-1 < (long)pwd.username) {
      lua_pushinteger((lua_State *)pwd.homedir,(lua_Integer)pwd.username);
      lua_setfield((lua_State *)pwd.homedir,-2,"uid");
    }
    if (-1 < pwd.uid) {
      lua_pushinteger((lua_State *)pwd.homedir,pwd.uid);
      lua_setfield((lua_State *)pwd.homedir,-2,"gid");
    }
    if (pwd.gid != 0) {
      lua_pushstring((lua_State *)pwd.homedir,(char *)pwd.gid);
      lua_setfield((lua_State *)pwd.homedir,-2,"shell");
    }
    if (pwd.shell != (char *)0x0) {
      lua_pushstring((lua_State *)pwd.homedir,pwd.shell);
      lua_setfield((lua_State *)pwd.homedir,-2,"homedir");
    }
    uv_os_free_passwd((uv_passwd_t *)auStack_40);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_os_get_passwd(lua_State* L) {
  uv_passwd_t pwd;
  int ret = uv_os_get_passwd(&pwd);
  if (ret < 0) return luv_error(L, ret);
  lua_newtable(L);
  if (pwd.username) {
    lua_pushstring(L, pwd.username);
    lua_setfield(L, -2, "username");
  }
  if (pwd.uid >= 0) {
    lua_pushinteger(L, pwd.uid);
    lua_setfield(L, -2, "uid");
  }
  if (pwd.gid >= 0) {
    lua_pushinteger(L, pwd.gid);
    lua_setfield(L, -2, "gid");
  }
  if (pwd.shell) {
    lua_pushstring(L, pwd.shell);
    lua_setfield(L, -2, "shell");
  }
  if (pwd.homedir) {
    lua_pushstring(L, pwd.homedir);
    lua_setfield(L, -2, "homedir");
  }
  uv_os_free_passwd(&pwd);
  return 1;
}